

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_cleanup_one(APITests *this)

{
  int iVar1;
  allocator local_49;
  string local_48;
  string local_28;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::cleanup((this->pin_data).in_a);
  iVar1 = GPIO::getmode();
  std::__cxx11::string::string((string *)&local_28,"",&local_49);
  assert::is_true(iVar1 == 0,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  GPIO::cleanup();
  iVar1 = GPIO::getmode();
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  assert::is_true(iVar1 == 4,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void test_cleanup_one()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::cleanup(pin_data.in_a);
        assert::is_true(GPIO::getmode() == GPIO::BOARD);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }